

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawStringPropDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  Decal *decal;
  bool bVar1;
  reference pcVar2;
  reference pvVar3;
  float fVar4;
  v2d_generic<float> local_74;
  v2d_generic<float> local_6c;
  v2d_generic<float> local_64;
  int local_5c;
  int local_58;
  int32_t oy;
  int32_t ox;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  vf2d spos;
  vf2d *scale_local;
  string *sText_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  Pixel col_local;
  
  spos = (vf2d)scale;
  this_local._4_4_ = col.field_0;
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)&__range1,0.0,0.0);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _ox = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ox);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    oy._3_1_ = *pcVar2;
    if (oy._3_1_ == '\n') {
      __range1._0_4_ = 0.0;
      __range1._4_4_ = *(float *)((long)spos + 4) * 8.0 + __range1._4_4_;
    }
    else {
      local_58 = (oy._3_1_ + -0x20) % 0x10;
      local_5c = (oy._3_1_ + -0x20) / 0x10;
      v2d_generic<float>::operator+(&local_64,pos);
      decal = this->fontDecal;
      fVar4 = (float)local_58;
      pvVar3 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
               operator[](&this->vFontSpacing,(long)(oy._3_1_ + -0x20));
      v2d_generic<float>::v2d_generic
                (&local_6c,fVar4 * 8.0 + (float)pvVar3->x,(float)local_5c * 8.0);
      pvVar3 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
               operator[](&this->vFontSpacing,(long)(oy._3_1_ + -0x20));
      v2d_generic<float>::v2d_generic(&local_74,(float)pvVar3->y,8.0);
      DrawPartialDecal(this,&local_64,decal,&local_6c,&local_74,(vf2d *)spos,
                       (Pixel *)((long)&this_local + 4));
      pvVar3 = std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::
               operator[](&this->vFontSpacing,(long)(oy._3_1_ + -0x20));
      __range1._0_4_ = (float)pvVar3->y * *(float *)spos + __range1._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringPropDecal(const olc::vf2d& pos, const std::string& sText, const Pixel col, const olc::vf2d& scale)
	{
		olc::vf2d spos = { 0.0f, 0.0f };
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0; spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, { float(ox) * 8.0f + float(vFontSpacing[c - 32].x), float(oy) * 8.0f }, { float(vFontSpacing[c - 32].y), 8.0f }, scale, col);
				spos.x += float(vFontSpacing[c - 32].y) * scale.x;
			}
		}
	}